

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

walk_result __thiscall
jsoncons::jsonschema::
max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::validate(max_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,json_pointer *instance_location,size_t count,error_reporter *reporter)

{
  int iVar1;
  walk_result wVar2;
  string local_1d0;
  string message;
  string local_190;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  validation_message local_138;
  
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(&this_context,context,
                 &(this->
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).keyword_name_);
  if (this->max_value_ < count) {
    std::__cxx11::to_string(&local_1d0,this->max_value_);
    std::operator+(&local_138.keyword_,"A schema can match a contains constraint at most ",
                   &local_1d0);
    std::operator+(&message,&local_138.keyword_," times");
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::to_string(&local_190,count);
    std::operator+(&local_1d0," but it matched ",&local_190);
    std::operator+(&local_138.keyword_,&local_1d0," times.");
    std::__cxx11::string::append((string *)&message);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_190);
    (*(this->
      super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).super_validation_message_factory._vptr_validation_message_factory[2])
              (&local_138,this,&this_context.eval_path_,instance_location,&message);
    reporter->error_count_ = reporter->error_count_ + 1;
    iVar1 = (*reporter->_vptr_error_reporter[2])(reporter,&local_138);
    validation_message::~validation_message(&local_138);
    std::__cxx11::string::~string((string *)&message);
    if (iVar1 == 1) {
      wVar2 = abort;
      goto LAB_00394357;
    }
  }
  wVar2 = advance;
LAB_00394357:
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context(&this_context);
  return wVar2;
}

Assistant:

walk_result validate(const eval_context<Json>& context, 
            const jsonpointer::json_pointer& instance_location,
            std::size_t count, 
            error_reporter& reporter) const 
        {
            eval_context<Json> this_context(context, this->keyword_name());

            if (count > max_value_)
            {
                std::string message("A schema can match a contains constraint at most " + std::to_string(max_value_) + " times");
                message.append(" but it matched " + std::to_string(count) + " times.");
                
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    std::move(message)));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }